

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

DecodeRawTransactionResponseStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionResponse::ConvertToStruct
          (DecodeRawTransactionResponseStruct *__return_storage_ptr__,
          DecodeRawTransactionResponse *this)

{
  vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  local_60;
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  local_48;
  undefined1 local_19;
  DecodeRawTransactionResponse *local_18;
  DecodeRawTransactionResponse *this_local;
  DecodeRawTransactionResponseStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DecodeRawTransactionResponse *)__return_storage_ptr__;
  DecodeRawTransactionResponseStruct::DecodeRawTransactionResponseStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->txid_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash,(string *)&this->hash_);
  __return_storage_ptr__->version = this->version_;
  __return_storage_ptr__->size = this->size_;
  __return_storage_ptr__->vsize = this->vsize_;
  __return_storage_ptr__->weight = this->weight_;
  __return_storage_ptr__->locktime = this->locktime_;
  core::
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxIn,_cfd::js::api::DecodeRawTransactionTxInStruct>
  ::ConvertToStruct(&local_48,&this->vin_);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ::operator=(&__return_storage_ptr__->vin,&local_48);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ::~vector(&local_48);
  core::
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxOut,_cfd::js::api::DecodeRawTransactionTxOutStruct>
  ::ConvertToStruct(&local_60,&this->vout_);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ::operator=(&__return_storage_ptr__->vout,&local_60);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ::~vector(&local_60);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionResponseStruct DecodeRawTransactionResponse::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionResponseStruct result;
  result.txid = txid_;
  result.hash = hash_;
  result.version = version_;
  result.size = size_;
  result.vsize = vsize_;
  result.weight = weight_;
  result.locktime = locktime_;
  result.vin = vin_.ConvertToStruct();
  result.vout = vout_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}